

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O1

AST * parse_relational_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST_Binary_Expression *left;
  AST *right;
  AST_Type type;
  
  left = (AST_Binary_Expression *)parse_shift_expression(translation_data,scope);
  do {
    if (translation_data->tokens->size == 0) {
      return (AST *)left;
    }
    iVar1 = *translation_data->tokens->first->data;
    if (iVar1 < 0x41) {
      type = OP_LESS;
      if (iVar1 != 0x2f) {
        if (iVar1 != 0x32) {
          return (AST *)left;
        }
        type = OP_GREATER;
      }
    }
    else if (iVar1 == 0x42) {
      type = OP_GREATER_EQ;
    }
    else {
      if (iVar1 != 0x41) {
        return (AST *)left;
      }
      type = OP_LESS_EQ;
    }
    chomp(translation_data);
    right = parse_shift_expression(translation_data,scope);
    left = get_binary_expression_tree((AST *)left,right,type);
  } while( true );
}

Assistant:

struct AST* parse_relational_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST *hold;
	hold=parse_shift_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_LESS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_LESS);
				break;
			case KW_LESS_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_LESS_EQ);
				break;
			case KW_MORE:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_GREATER);
				break;
			case KW_MORE_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_GREATER_EQ);
				break;
			default:
				return hold;
		}
	}
	return hold;
}